

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O2

void __thiscall
FNodeBuilder::Extract
          (FNodeBuilder *this,node_t **outNodes,int *nodeCount,seg_t **outSegs,
          glsegextra_t **outSegExtras,int *segCount,subsector_t **outSubs,int *subCount,
          vertex_t **outVerts,int *vertCount)

{
  undefined8 uVar1;
  uint uVar2;
  FPrivVert *pFVar3;
  FPrivSeg *pFVar4;
  FLevel *pFVar5;
  line_t *plVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  sector_t *psVar12;
  int iVar13;
  vertex_t *pvVar14;
  size_t sVar15;
  subsector_t *psVar16;
  node_t *pnVar17;
  long lVar18;
  seg_t *psVar19;
  glsegextra_t *pgVar20;
  DWORD DVar21;
  USegPtr *pUVar22;
  vertex_t *pvVar23;
  long lVar24;
  long lVar25;
  glseg_t *pgVar26;
  size_t sVar27;
  node_t *pnVar28;
  long lVar29;
  undefined8 *puVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  byte bVar34;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> segs;
  
  bVar34 = 0;
  uVar2 = (this->Vertices).Count;
  uVar32 = (ulong)(int)uVar2;
  *vertCount = uVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar32;
  uVar33 = SUB168(auVar7 * ZEXT816(0x38),0);
  if (SUB168(auVar7 * ZEXT816(0x38),8) != 0) {
    uVar33 = 0xffffffffffffffff;
  }
  pvVar14 = (vertex_t *)operator_new__(uVar33);
  if (uVar32 != 0) {
    pvVar23 = pvVar14;
    do {
      (pvVar23->p).X = 0.0;
      (pvVar23->p).Y = 0.0;
      pvVar23->viewangle = 0;
      pvVar23->angletime = 0;
      pvVar23->dirty = true;
      pvVar23->numheights = 0;
      pvVar23->numsectors = 0;
      pvVar23->sectors = (sector_t **)0x0;
      pvVar23->heightlist = (float *)0x0;
      pvVar23 = pvVar23 + 1;
    } while (pvVar23 != pvVar14 + uVar32);
  }
  *outVerts = pvVar14;
  pFVar3 = (this->Vertices).Array;
  uVar32 = 0;
  uVar33 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar33 = uVar32;
  }
  for (; uVar33 * 0x10 != uVar32; uVar32 = uVar32 + 0x10) {
    uVar1 = *(undefined8 *)((long)&(pFVar3->super_FSimpleVert).x + uVar32);
    (pvVar14->p).X = (double)(int)uVar1 * 1.52587890625e-05;
    (pvVar14->p).Y = (double)(int)((ulong)uVar1 >> 0x20) * 1.52587890625e-05;
    pvVar14 = pvVar14 + 1;
  }
  uVar2 = (this->Subsectors).Count;
  *subCount = uVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)(int)uVar2;
  sVar15 = SUB168(auVar8 * ZEXT816(0x60),0);
  sVar27 = sVar15;
  if (SUB168(auVar8 * ZEXT816(0x60),8) != 0) {
    sVar27 = 0xffffffffffffffff;
  }
  psVar16 = (subsector_t *)operator_new__(sVar27);
  *outSubs = psVar16;
  lVar31 = 0;
  memset(psVar16,0,sVar15);
  uVar2 = (this->Nodes).Count;
  uVar33 = (ulong)(int)uVar2;
  *nodeCount = uVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar33;
  sVar15 = SUB168(auVar9 * ZEXT816(0x48),0);
  sVar27 = sVar15;
  if (SUB168(auVar9 * ZEXT816(0x48),8) != 0) {
    sVar27 = 0xffffffffffffffff;
  }
  pnVar17 = (node_t *)operator_new__(sVar27);
  *outNodes = pnVar17;
  memcpy(pnVar17,(this->Nodes).Array,sVar15);
  lVar18 = 0x10;
  for (; lVar31 < (int)uVar33; lVar31 = lVar31 + 1) {
    for (uVar33 = 1; -1 < (int)uVar33; uVar33 = (ulong)((int)uVar33 - 1)) {
      pnVar17 = *outNodes;
      uVar2 = pnVar17[lVar31].field_6.intchildren[uVar33];
      pnVar28 = (node_t *)((long)&(*outSubs)[uVar2 & 0x7fffffff].sector + 1);
      if (-1 < (int)uVar2) {
        pnVar28 = pnVar17 + uVar2;
      }
      pnVar17[lVar31].field_6.children[uVar33] = pnVar28;
    }
    lVar24 = lVar18;
    for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
      for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
        *(float *)((long)&(*outNodes)->x + lVar29 * 4 + lVar24) =
             (float)*(int *)((long)&(*outNodes)->x + lVar29 * 4 + lVar24) * 1.5258789e-05;
      }
      lVar24 = lVar24 + 0x10;
    }
    uVar33 = (ulong)(uint)*nodeCount;
    lVar18 = lVar18 + 0x48;
  }
  if (this->GLNodes == true) {
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::TArray(&segs,(this->Segs).Count * 5 >> 2);
    lVar31 = 0x28;
    for (lVar18 = 0; lVar18 < *subCount; lVar18 = lVar18 + 1) {
      iVar13 = CloseSubsector(this,&segs,(int)lVar18,*outVerts);
      psVar16 = *outSubs;
      *(int *)((long)&((subsector_t *)(psVar16->portalcoverage + -4))->sector + lVar31) = iVar13;
      *(ulong *)((long)(psVar16->portalcoverage + -5) + lVar31) = (ulong)(segs.Count - iVar13);
      lVar31 = lVar31 + 0x60;
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)(int)segs.Count;
    *segCount = segs.Count;
    uVar33 = SUB168(auVar11 * ZEXT816(0x48),0);
    if (SUB168(auVar11 * ZEXT816(0x48),8) != 0) {
      uVar33 = 0xffffffffffffffff;
    }
    psVar19 = (seg_t *)operator_new__(uVar33);
    *outSegs = psVar19;
    uVar33 = (long)(int)segs.Count << 4;
    if ((int)segs.Count < 0) {
      uVar33 = 0xffffffffffffffff;
    }
    pgVar20 = (glsegextra_t *)operator_new__(uVar33);
    *outSegExtras = pgVar20;
    lVar31 = 0;
    lVar18 = 0;
    for (lVar24 = 0; lVar24 < (int)segs.Count; lVar24 = lVar24 + 1) {
      pgVar26 = segs.Array;
      puVar30 = (undefined8 *)((long)&(*outSegs)->v1 + lVar31);
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        *puVar30 = (pgVar26->super_seg_t).v1;
        pgVar26 = (glseg_t *)((long)pgVar26 + (ulong)bVar34 * -0x10 + 8);
        puVar30 = puVar30 + (ulong)bVar34 * -2 + 1;
      }
      DVar21 = 0xffffffff;
      if ((ulong)(segs.Array)->Partner != 0xffffffff) {
        DVar21 = (this->Segs).Array[(segs.Array)->Partner].storedseg;
      }
      *(DWORD *)((long)&(*outSegExtras)->PartnerSeg + lVar18) = DVar21;
      segs.Count = *segCount;
      lVar18 = lVar18 + 0x10;
      lVar31 = lVar31 + 0x48;
      segs.Array = segs.Array + 1;
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray(&segs);
  }
  else {
    memcpy(*outSubs,(this->Subsectors).Array,(long)*subCount * 0x60);
    uVar2 = (this->Segs).Count;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)(int)uVar2;
    *segCount = uVar2;
    uVar33 = 0xffffffffffffffff;
    if (SUB168(auVar10 * ZEXT816(0x48),8) == 0) {
      uVar33 = SUB168(auVar10 * ZEXT816(0x48),0);
    }
    psVar19 = (seg_t *)operator_new__(uVar33);
    *outSegs = psVar19;
    *outSegExtras = (glsegextra_t *)0x0;
    pFVar4 = (this->Segs).Array;
    pUVar22 = (this->SegList).Array;
    pFVar5 = this->Level;
    lVar31 = 0;
    uVar33 = 0;
    if (0 < (int)uVar2) {
      uVar33 = (ulong)uVar2;
    }
    for (; uVar33 * 9 != lVar31; lVar31 = lVar31 + 9) {
      uVar2 = pUVar22->SegNum;
      psVar19 = *outSegs;
      (&psVar19->v1)[lVar31] = *outVerts + pFVar4[uVar2].v1;
      (&psVar19->v2)[lVar31] = *outVerts + pFVar4[uVar2].v2;
      psVar12 = (&pFVar4[uVar2].frontsector)[1];
      (&psVar19->frontsector)[lVar31] = pFVar4[uVar2].frontsector;
      (&psVar19->frontsector + lVar31)[1] = psVar12;
      (&psVar19->linedef)[lVar31] = pFVar5->Lines + pFVar4[uVar2].linedef;
      (&psVar19->sidedef)[lVar31] = pFVar5->Sides + pFVar4[uVar2].sidedef;
      pUVar22 = (USegPtr *)(&pUVar22->SegNum + 2);
    }
  }
  uVar32 = 0;
  uVar33 = (ulong)(uint)*subCount;
  if (*subCount < 1) {
    uVar33 = uVar32;
  }
  for (; uVar33 * 0x60 - uVar32 != 0; uVar32 = uVar32 + 0x60) {
    *(seg_t **)((long)(*outSubs)->portalcoverage + (uVar32 - 0x28)) =
         *outSegs + *(long *)((long)(*outSubs)->portalcoverage + (uVar32 - 0x28));
  }
  pFVar5 = this->Level;
  uVar2 = pFVar5->NumLines;
  uVar32 = 0;
  uVar33 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar33 = uVar32;
  }
  for (; uVar33 * 0x98 - uVar32 != 0; uVar32 = uVar32 + 0x98) {
    plVar6 = pFVar5->Lines;
    *(vertex_t **)((long)plVar6->args + (uVar32 - 0x2c)) =
         *outVerts + *(long *)((long)plVar6->args + (uVar32 - 0x2c));
    *(vertex_t **)((long)plVar6->args + (uVar32 - 0x24)) =
         *outVerts + *(long *)((long)plVar6->args + (uVar32 - 0x24));
  }
  return;
}

Assistant:

void FNodeBuilder::Extract (node_t *&outNodes, int &nodeCount,
	seg_t *&outSegs, glsegextra_t *&outSegExtras, int &segCount,
	subsector_t *&outSubs, int &subCount,
	vertex_t *&outVerts, int &vertCount)
{
	int i;

	vertCount = Vertices.Size ();
	outVerts = new vertex_t[vertCount];

	for (i = 0; i < vertCount; ++i)
	{
		outVerts[i].set(Vertices[i].x, Vertices[i].y);
	}

	subCount = Subsectors.Size();
	outSubs = new subsector_t[subCount];
	memset(outSubs, 0, subCount * sizeof(subsector_t));

	nodeCount = Nodes.Size ();
	outNodes = new node_t[nodeCount];

	memcpy (outNodes, &Nodes[0], nodeCount*sizeof(node_t));
	for (i = 0; i < nodeCount; ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:  Splitter[%08x,%08x] [%08x,%08x]\n", i,
			outNodes[i].x, outNodes[i].y, outNodes[i].dx, outNodes[i].dy));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (outNodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", outNodes[i].intchildren[j] & 0x7FFFFFFF));
				outNodes[i].children[j] = (BYTE *)(outSubs + (outNodes[i].intchildren[j] & 0x7fffffff)) + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", outNodes[i].intchildren[j]));
				outNodes[i].children[j] = outNodes + outNodes[i].intchildren[j];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				outNodes[i].bbox[j][k] = FIXED2FLOAT(outNodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> segs (Segs.Size()*5/4);

		for (i = 0; i < subCount; ++i)
		{
			DWORD numsegs = CloseSubsector (segs, i, outVerts);
			outSubs[i].numlines = numsegs;
			outSubs[i].firstline = (seg_t *)(size_t)(segs.Size() - numsegs);
		}

		segCount = segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = new glsegextra_t[segCount];

		for (i = 0; i < segCount; ++i)
		{
			outSegs[i] = *(seg_t *)&segs[i];

			if (segs[i].Partner != DWORD_MAX)
			{
				outSegExtras[i].PartnerSeg = Segs[segs[i].Partner].storedseg;
			}
			else
			{
				outSegExtras[i].PartnerSeg = DWORD_MAX;
			}
		}
	}
	else
	{
		memcpy (outSubs, &Subsectors[0], subCount*sizeof(subsector_t));
		segCount = Segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = NULL;
		for (i = 0; i < segCount; ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &outSegs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = outVerts + org->v1;
			out->v2 = outVerts + org->v2;
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			out->linedef = Level.Lines + org->linedef;
			out->sidedef = Level.Sides + org->sidedef;
		}
	}
	for (i = 0; i < subCount; ++i)
	{
		outSubs[i].firstline = &outSegs[(size_t)outSubs[i].firstline];
	}

	D(Printf("%i segs, %i nodes, %i subsectors\n", segCount, nodeCount, subCount));

	for (i = 0; i < Level.NumLines; ++i)
	{
		Level.Lines[i].v1 = outVerts + (size_t)Level.Lines[i].v1;
		Level.Lines[i].v2 = outVerts + (size_t)Level.Lines[i].v2;
	}
}